

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<float>,_ImPlot::GetterXsYRef<float>,_ImPlot::TransformerLinLin>::
operator()(ShadedRenderer<ImPlot::GetterXsYs<float>,_ImPlot::GetterXsYRef<float>,_ImPlot::TransformerLinLin>
           *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  GetterXsYs<float> *pGVar5;
  GetterXsYRef<float> *pGVar6;
  ImDrawVert *pIVar7;
  ImDrawIdx *pIVar8;
  ImVec2 IVar9;
  float fVar10;
  undefined1 auVar11 [12];
  int iVar12;
  long lVar13;
  ImDrawIdx IVar14;
  ushort uVar15;
  ImPlotContext *gp;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  float fVar21;
  float fVar22;
  ImVec2 IVar23;
  double dVar24;
  float fVar25;
  float fVar26;
  double dVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  undefined1 auVar37 [16];
  
  pGVar5 = this->Getter1;
  pGVar6 = this->Getter2;
  iVar12 = pGVar5->Count;
  iVar3 = this->Transformer->YAxis;
  iVar4 = pGVar6->Count;
  IVar23 = GImPlot->PixelRange[iVar3].Min;
  dVar24 = (double)IVar23.x;
  dVar27 = (double)IVar23.y;
  dVar1 = (GImPlot->CurrentPlot->XAxis).Range.Min;
  dVar2 = GImPlot->CurrentPlot->YAxis[iVar3].Range.Min;
  lVar13 = (long)(((pGVar5->Offset + prim + 1) % iVar12 + iVar12) % iVar12) * (long)pGVar5->Stride;
  fVar21 = (float)(((double)*(float *)((long)pGVar5->Xs + lVar13) - dVar1) * GImPlot->Mx + dVar24);
  fVar22 = (float)(((double)*(float *)((long)pGVar5->Ys + lVar13) - dVar2) * GImPlot->My[iVar3] +
                  dVar27);
  IVar23.x = (float)(((double)*(float *)((long)pGVar6->Xs +
                                        (long)(((prim + 1 + pGVar6->Offset) % iVar4 + iVar4) % iVar4
                                              ) * (long)pGVar6->Stride) - dVar1) * GImPlot->Mx +
                    dVar24);
  IVar23.y = (float)((pGVar6->YRef - dVar2) * GImPlot->My[iVar3] + dVar27);
  fVar10 = (this->P12).x;
  fVar25 = (this->P12).y;
  fVar28 = (this->P11).x;
  fVar29 = (this->P11).y;
  uVar19 = -(uint)(fVar29 < fVar25);
  fVar26 = (float)(~-(uint)(fVar10 <= fVar28) & (uint)fVar10 |
                  (uint)fVar28 & -(uint)(fVar10 <= fVar28));
  fVar30 = (float)(~-(uint)(fVar25 <= fVar29) & (uint)fVar25 |
                  (uint)fVar29 & -(uint)(fVar25 <= fVar29));
  fVar33 = (float)(~-(uint)(fVar28 < fVar10) & (uint)fVar10 |
                  (uint)fVar28 & -(uint)(fVar28 < fVar10));
  fVar41 = (float)(~uVar19 & (uint)fVar25 | (uint)fVar29 & uVar19);
  uVar16 = -(uint)(fVar21 <= fVar26);
  uVar17 = -(uint)(fVar22 <= fVar30);
  uVar18 = -(uint)(fVar33 < fVar21);
  uVar20 = -(uint)(fVar41 < fVar22);
  fVar26 = (float)(~uVar16 & (uint)fVar21 | (uint)fVar26 & uVar16);
  fVar30 = (float)(~uVar17 & (uint)fVar22 | (uint)fVar30 & uVar17);
  fVar33 = (float)(~uVar18 & (uint)fVar21 | (uint)fVar33 & uVar18);
  fVar41 = (float)(~uVar20 & (uint)fVar22 | (uint)fVar41 & uVar20);
  uVar16 = -(uint)(IVar23.x <= fVar26);
  uVar17 = -(uint)(IVar23.y <= fVar30);
  uVar18 = -(uint)(fVar33 < IVar23.x);
  uVar20 = -(uint)(fVar41 < IVar23.y);
  auVar32._0_4_ = (uint)fVar26 & uVar16;
  auVar32._4_4_ = (uint)fVar30 & uVar17;
  auVar32._8_4_ = (uint)fVar33 & uVar18;
  auVar32._12_4_ = (uint)fVar41 & uVar20;
  auVar38._0_4_ = ~uVar16 & (uint)IVar23.x;
  auVar38._4_4_ = ~uVar17 & (uint)IVar23.y;
  auVar38._8_4_ = ~uVar18 & (uint)IVar23.x;
  auVar38._12_4_ = ~uVar20 & (uint)IVar23.y;
  auVar38 = auVar38 | auVar32;
  fVar26 = (cull_rect->Min).y;
  auVar40._4_4_ = -(uint)(fVar26 < auVar38._4_4_);
  auVar40._0_4_ = -(uint)((cull_rect->Min).x < auVar38._0_4_);
  auVar11._4_8_ = auVar38._8_8_;
  auVar11._0_4_ = -(uint)(auVar38._4_4_ < fVar26);
  auVar39._0_8_ = auVar11._0_8_ << 0x20;
  auVar39._8_4_ = -(uint)(auVar38._8_4_ < (cull_rect->Max).x);
  auVar39._12_4_ = -(uint)(auVar38._12_4_ < (cull_rect->Max).y);
  auVar40._8_8_ = auVar39._8_8_;
  iVar12 = movmskps((int)cull_rect,auVar40);
  if (iVar12 == 0xf) {
    fVar30 = fVar22 * fVar28 - fVar29 * fVar21;
    fVar33 = IVar23.y * fVar10 - fVar25 * IVar23.x;
    fVar26 = fVar25 - IVar23.y;
    auVar34._4_4_ = fVar26;
    auVar34._0_4_ = fVar26;
    auVar34._8_4_ = fVar26;
    auVar34._12_4_ = fVar26;
    auVar35._4_12_ = auVar34._4_12_;
    auVar35._0_4_ = fVar26 * (fVar28 - fVar21) - (fVar29 - fVar22) * (fVar10 - IVar23.x);
    auVar31._0_4_ = fVar30 * (fVar10 - IVar23.x) - fVar33 * (fVar28 - fVar21);
    auVar31._4_4_ = fVar30 * fVar26 - fVar33 * (fVar29 - fVar22);
    auVar31._8_4_ = fVar22 * 0.0 - IVar23.y * 0.0;
    auVar31._12_4_ = fVar22 * 0.0 - IVar23.y * 0.0;
    auVar37._0_8_ = auVar35._0_8_;
    auVar37._8_4_ = fVar26;
    auVar37._12_4_ = fVar26;
    auVar36._8_8_ = auVar37._8_8_;
    auVar36._4_4_ = auVar35._0_4_;
    auVar36._0_4_ = auVar35._0_4_;
    auVar32 = divps(auVar31,auVar36);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7->col = this->Col;
    IVar9.y = fVar22;
    IVar9.x = fVar21;
    pIVar7[1].pos = IVar9;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7[1].col = this->Col;
    pIVar7[2].pos = auVar32._0_8_;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7[2].col = this->Col;
    pIVar7[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7[3].col = this->Col;
    pIVar7[4].pos = IVar23;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar7 + 5;
    uVar16 = DrawList->_VtxCurrentIdx;
    pIVar8 = DrawList->_IdxWritePtr;
    IVar14 = (ImDrawIdx)uVar16;
    *pIVar8 = IVar14;
    uVar15 = (byte)((byte)uVar19 & IVar23.y < fVar22 | -(fVar25 < fVar29) & -(fVar22 < IVar23.y)) &
             1;
    pIVar8[1] = IVar14 + uVar15 + 1;
    pIVar8[2] = IVar14 + 3;
    pIVar8[3] = IVar14 + 1;
    pIVar8[4] = (uVar15 ^ 3) + IVar14;
    pIVar8[5] = IVar14 + 4;
    DrawList->_IdxWritePtr = pIVar8 + 6;
    DrawList->_VtxCurrentIdx = uVar16 + 5;
  }
  (this->P11).x = fVar21;
  (this->P11).y = fVar22;
  (this->P12).x = IVar23.x;
  (this->P12).y = IVar23.y;
  return (char)iVar12 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }